

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  value_type *pvVar2;
  float fVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  if (column_index < 0) {
    column_index = (pIVar1->DC).ColumnsCurrent;
  }
  if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (pIVar1->DC).ColumnsSetId + column_index)) {
    fVar3 = GetDraggedColumnOffset(column_index);
    return fVar3;
  }
  if (column_index < (pIVar1->DC).ColumnsData.Size) {
    pvVar2 = ImVector<ImGuiColumnData>::operator[](&(pIVar1->DC).ColumnsData,column_index);
    fVar3 = (pIVar1->DC).ColumnsMinX;
    return (float)(int)(((pIVar1->DC).ColumnsMaxX - fVar3) * pvVar2->OffsetNorm + fVar3);
  }
  __assert_fail("column_index < window->DC.ColumnsData.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x2468,"float ImGui::GetColumnOffset(int)");
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    if (g.ActiveId)
    {
        const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
        if (g.ActiveId == column_id)
            return GetDraggedColumnOffset(column_index);
    }

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);
    const float t = window->DC.ColumnsData[column_index].OffsetNorm;
    const float x_offset = window->DC.ColumnsMinX + t * (window->DC.ColumnsMaxX - window->DC.ColumnsMinX);
    return (float)(int)x_offset;
}